

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O2

void GEN_CS::gen_cs_example_dm<false>(cb_to_cs *c,example *ec,label *cs_ld)

{
  label *this;
  wclass *pwVar1;
  cb_class *pcVar2;
  long lVar3;
  ulong uVar4;
  uint32_t i;
  float fVar5;
  wclass *pwVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  cb_class *__end3;
  wclass local_48;
  v_array<COST_SENSITIVE::wclass> *local_38;
  
  pwVar6 = (ec->l).cs.costs._begin;
  pwVar1 = (ec->l).cs.costs._end;
  local_38 = &cs_ld->costs;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_ld->costs);
  this = &c->pred_scores;
  v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
  lVar3 = (long)pwVar1 - (long)pwVar6 >> 4;
  if ((lVar3 == 0) || ((lVar3 == 1 && ((pwVar6->x != 3.4028235e+38 || (NAN(pwVar6->x))))))) {
    __end3 = (cb_class *)0x7f7fffff;
    fVar7 = 1.4013e-45;
    for (fVar5 = 1.4013e-45; (uint)fVar5 <= c->num_actions; fVar5 = (float)((int)fVar5 + 1)) {
      local_48.x = 0.0;
      local_48.partial_prediction = 0.0;
      local_48.wap_value = 0.0;
      local_48.class_index = (uint32_t)fVar5;
      fVar8 = CB_ALGS::get_cost_pred<false>(c->scorer,c->known_cost,ec,(uint32_t)fVar5,0);
      if (fVar8 < __end3._0_4_) {
        fVar7 = fVar5;
      }
      local_48.x = fVar8;
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_48);
      pcVar2 = c->known_cost;
      if ((pcVar2 != (cb_class *)0x0) && (fVar5 == (float)pcVar2->action)) {
        uVar4 = c->nb_ex_regressors + 1;
        c->nb_ex_regressors = uVar4;
        fVar9 = pcVar2->cost - local_48.x;
        c->avg_loss_regressors =
             (fVar9 * fVar9 - c->avg_loss_regressors) * (1.0 / (float)uVar4) +
             c->avg_loss_regressors;
        c->last_pred_reg = local_48.x;
        c->last_correct_cost = pcVar2->cost;
      }
      if (__end3._0_4_ <= fVar8) {
        fVar8 = __end3._0_4_;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_48);
      __end3 = (cb_class *)(ulong)(uint)fVar8;
    }
  }
  else {
    fVar5 = 3.4028235e+38;
    fVar7 = 1.4013e-45;
    for (; pwVar6 != pwVar1; pwVar6 = pwVar6 + 1) {
      local_48.x = 0.0;
      local_48.class_index = pwVar6->class_index;
      local_48.partial_prediction = 0.0;
      local_48.wap_value = 0.0;
      local_48.x = CB_ALGS::get_cost_pred<false>(c->scorer,c->known_cost,ec,local_48.class_index,0);
      if (fVar5 <= local_48.x) {
        if (((local_48.x == fVar5) && (!NAN(local_48.x) && !NAN(fVar5))) &&
           (fVar8 = (float)pwVar6->class_index, (uint)fVar8 < (uint)fVar7)) goto LAB_001d2655;
      }
      else {
        fVar8 = (float)pwVar6->class_index;
LAB_001d2655:
        fVar5 = local_48.x;
        fVar7 = fVar8;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,&local_48);
      pcVar2 = c->known_cost;
      if ((pcVar2 != (cb_class *)0x0) && (pcVar2->action == pwVar6->class_index)) {
        uVar4 = c->nb_ex_regressors + 1;
        c->nb_ex_regressors = uVar4;
        fVar8 = pcVar2->cost - local_48.x;
        c->avg_loss_regressors =
             (fVar8 * fVar8 - c->avg_loss_regressors) * (1.0 / (float)uVar4) +
             c->avg_loss_regressors;
        c->last_pred_reg = local_48.x;
        c->last_correct_cost = pcVar2->cost;
      }
      v_array<COST_SENSITIVE::wclass>::push_back(local_38,&local_48);
    }
  }
  (ec->pred).scalar = fVar7;
  return;
}

Assistant:

void gen_cs_example_dm(cb_to_cs& c, example& ec, COST_SENSITIVE::label& cs_ld)
{  // this implements the direct estimation method, where costs are directly specified by the learned regressor.
  CB::label ld = ec.l.cb;

  float min = FLT_MAX;
  uint32_t argmin = 1;
  // generate cost sensitive example
  cs_ld.costs.clear();
  c.pred_scores.costs.clear();

  if (ld.costs.size() == 0 ||
      (ld.costs.size() == 1 &&
          ld.costs[0].cost != FLT_MAX))  // this is a typical example where we can perform all actions
  {                                      // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {
      COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, i, 0);
      if (wc.x < min)
      {
        min = wc.x;
        argmin = i;
      }

      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == i)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
  else  // this is an example where we can only perform a subset of the actions
  {     // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs)
    {
      COST_SENSITIVE::wclass wc = {0., cl.action, 0., 0.};

      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, cl.action, 0);
      if (wc.x < min || (wc.x == min && cl.action < argmin))
      {
        min = wc.x;
        argmin = cl.action;
      }
      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == cl.action)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }

  ec.pred.multiclass = argmin;
}